

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.h
# Opt level: O3

XYZ __thiscall pbrt::RGBColorSpace::ToXYZ(RGBColorSpace *this,RGB *rgb)

{
  Float *pFVar1;
  undefined1 auVar2 [16];
  RGB *pRVar3;
  SquareMatrix<3> *pSVar4;
  int i;
  int iVar5;
  long lVar6;
  int j;
  Float *pFVar7;
  long lVar8;
  XYZ XVar9;
  Float local_1c;
  undefined8 local_18;
  
  pSVar4 = &this->XYZFromRGB;
  lVar6 = 0;
  local_18 = 0;
  local_1c = 0.0;
  do {
    iVar5 = (int)lVar6;
    pFVar7 = (Float *)&local_18;
    if ((iVar5 != 0) && (pFVar7 = (Float *)((long)&local_18 + 4), iVar5 != 1)) {
      pFVar7 = &local_1c;
    }
    *pFVar7 = 0.0;
    lVar8 = 0;
    do {
      pRVar3 = rgb;
      if (((int)lVar8 != 0) && (pRVar3 = (RGB *)&rgb->g, (int)lVar8 != 1)) {
        pRVar3 = (RGB *)&rgb->b;
      }
      pFVar7 = (Float *)&local_18;
      if ((iVar5 != 0) && (pFVar7 = (Float *)((long)&local_18 + 4), iVar5 != 1)) {
        pFVar7 = &local_1c;
      }
      pFVar1 = pSVar4->m[0] + lVar8;
      lVar8 = lVar8 + 1;
      auVar2 = vfmadd213ss_fma(ZEXT416((uint)pRVar3->r),ZEXT416((uint)*pFVar1),
                               ZEXT416((uint)*pFVar7));
      *pFVar7 = auVar2._0_4_;
    } while (lVar8 != 3);
    lVar6 = lVar6 + 1;
    pSVar4 = (SquareMatrix<3> *)(pSVar4->m + 1);
  } while (lVar6 != 3);
  XVar9.Z = local_1c;
  XVar9.X = (Float)(undefined4)local_18;
  XVar9.Y = (Float)local_18._4_4_;
  return XVar9;
}

Assistant:

PBRT_CPU_GPU
    XYZ ToXYZ(const RGB &rgb) const { return Mul<XYZ>(XYZFromRGB, rgb); }